

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

int __thiscall
trompeloeil::
list_elem<trompeloeil::condition_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
::unlink(list_elem<trompeloeil::condition_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
         *this,char *__name)

{
  list_elem<trompeloeil::condition_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
  *plVar1;
  list_elem<trompeloeil::condition_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
  *plVar2;
  int extraout_EAX;
  list_elem<trompeloeil::condition_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
  *p;
  list_elem<trompeloeil::condition_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
  *n;
  list_elem<trompeloeil::condition_base<std::reference_wrapper<int>_&(std::reference_wrapper<int>_&)>_>
  *this_local;
  
  invariant_check(this);
  plVar1 = this->next;
  plVar2 = this->prev;
  plVar1->prev = plVar2;
  plVar2->next = plVar1;
  this->next = this;
  this->prev = this;
  invariant_check(this);
  return extraout_EAX;
}

Assistant:

void
    unlink()
    noexcept
    {
      invariant_check();
      auto n = next;
      auto p = prev;
      n->prev = p;
      p->next = n;
      next = this;
      prev = this;
      invariant_check();
    }